

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ed25519.cc
# Opt level: O2

int pkey_ed25519_sign_message
              (EVP_PKEY_CTX *ctx,uint8_t *sig,size_t *siglen,uint8_t *tbs,size_t tbslen)

{
  uint8_t *private_key;
  int iVar1;
  int iVar2;
  int line;
  
  private_key = (uint8_t *)ctx->pkey->pkey;
  if (private_key[0x40] == '\0') {
    line = 0x33;
    iVar1 = 0x82;
LAB_001908bc:
    iVar2 = 0;
    ERR_put_error(6,0,iVar1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ed25519.cc"
                  ,line);
  }
  else {
    if (sig != (uint8_t *)0x0) {
      if (*siglen < 0x40) {
        iVar1 = 100;
        line = 0x3d;
        goto LAB_001908bc;
      }
      iVar1 = ED25519_sign(sig,tbs,tbslen,private_key);
      if (iVar1 == 0) {
        return 0;
      }
    }
    *siglen = 0x40;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int pkey_ed25519_sign_message(EVP_PKEY_CTX *ctx, uint8_t *sig,
                                     size_t *siglen, const uint8_t *tbs,
                                     size_t tbslen) {
  const ED25519_KEY *key =
      reinterpret_cast<const ED25519_KEY *>(ctx->pkey->pkey);
  if (!key->has_private) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_NOT_A_PRIVATE_KEY);
    return 0;
  }

  if (sig == NULL) {
    *siglen = 64;
    return 1;
  }

  if (*siglen < 64) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_BUFFER_TOO_SMALL);
    return 0;
  }

  if (!ED25519_sign(sig, tbs, tbslen, key->key)) {
    return 0;
  }

  *siglen = 64;
  return 1;
}